

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono-test.cc
# Opt level: O0

void __thiscall ChronoTest_Align_Test::~ChronoTest_Align_Test(ChronoTest_Align_Test *this)

{
  void *in_RDI;
  
  ~ChronoTest_Align_Test((ChronoTest_Align_Test *)0x1195e8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(ChronoTest, Align) {
  auto s = std::chrono::seconds(42);
  EXPECT_EQ("42s  ", fmt::format("{:5}", s));
  EXPECT_EQ("42s  ", fmt::format("{:{}}", s, 5));
  EXPECT_EQ("  42s", fmt::format("{:>5}", s));
  EXPECT_EQ("**42s**", fmt::format("{:*^7}", s));
  EXPECT_EQ("03:25:45    ",
            fmt::format("{:12%H:%M:%S}", std::chrono::seconds(12345)));
  EXPECT_EQ("    03:25:45",
            fmt::format("{:>12%H:%M:%S}", std::chrono::seconds(12345)));
  EXPECT_EQ("~~03:25:45~~",
            fmt::format("{:~^12%H:%M:%S}", std::chrono::seconds(12345)));

}